

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellIntrinsics.cpp
# Opt level: O0

void __thiscall RawDataHandleStorage::RawDataHandleStorage(RawDataHandleStorage *this,FILE *f)

{
  size_t sVar1;
  void *pvVar2;
  FILE *f_local;
  RawDataHandleStorage *this_local;
  
  MiniScript::RefCountedStorage::RefCountedStorage(&this->super_RefCountedStorage);
  (this->super_RefCountedStorage)._vptr_RefCountedStorage =
       (_func_int **)&PTR__RawDataHandleStorage_00197550;
  fseek((FILE *)f,0,2);
  sVar1 = ftell((FILE *)f);
  this->dataSize = sVar1;
  pvVar2 = malloc(this->dataSize);
  this->data = pvVar2;
  if (this->data != (void *)0x0) {
    fseek((FILE *)f,0,0);
    fread(this->data,1,this->dataSize,(FILE *)f);
  }
  return;
}

Assistant:

RawDataHandleStorage(FILE *f) {
		fseek(f, 0, SEEK_END);
		dataSize = ftell(f);
		data = malloc(dataSize);
		if (data) {
			fseek(f, 0, SEEK_SET);
			fread(data, 1, dataSize, f);
		}
	}